

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::recoverFromError(Reader *this,TokenType skipUntilToken)

{
  bool bVar1;
  int in_ESI;
  size_type in_RDI;
  deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *unaff_retaddr;
  Token skip;
  size_t errorCount;
  int local_30;
  Token *in_stack_ffffffffffffffd8;
  Reader *in_stack_ffffffffffffffe0;
  
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::size
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)0x1ec55f);
  do {
    bVar1 = readToken(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (!bVar1) {
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
                (unaff_retaddr,in_RDI);
    }
  } while ((local_30 != in_ESI) && (local_30 != 0));
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
            (unaff_retaddr,in_RDI);
  return false;
}

Assistant:

bool Reader::recoverFromError(TokenType skipUntilToken) {
  size_t const errorCount = errors_.size();
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}